

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O1

void __thiscall gl3cts::TransformFeedback::Tests::Tests(Tests *this,Context *context)

{
  TestContext *pTVar1;
  Context *pCVar2;
  TestNode *pTVar3;
  undefined8 *puVar4;
  CaptureGeometrySeparate *this_00;
  QueryGeometryInterleaved *this_01;
  QueryVertexSeparate *this_02;
  QueryGeometrySeparate *this_03;
  
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)this,context->m_testCtx,"transform_feedback",
             "Transform Feedback Test Suite");
  (this->super_TestCaseGroup).m_context = context;
  (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__Tests_02106b00;
  pTVar3 = (TestNode *)operator_new(200);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,context->m_testCtx,"api_errors_test",
             "Transform Feedback API Errors Test");
  pTVar3[1]._vptr_TestNode = (_func_int **)context;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__APIErrors_02106b38;
  pTVar3[1].m_testCtx = (TestContext *)context;
  pTVar3[1].m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar3[1].m_name._M_string_length = 0;
  pTVar3[1].m_name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pTVar3[1].m_name.field_2 + 8) = 0;
  *(undefined8 *)((long)&pTVar3[1].m_name.field_2 + 0xc) = 0;
  *(undefined8 *)((long)&pTVar3[1].m_description._M_dataplus._M_p + 4) = 0;
  pTVar3[1].m_description.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pTVar3[1].m_description.field_2 + 8) = 0;
  *(undefined8 *)&pTVar3[1].m_nodeType = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  pTVar3 = (TestNode *)operator_new(0x80);
  pTVar1 = (TestContext *)(this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,(TestContext *)pTVar1->m_platform,"linking_errors_test",
             "Transform Feedback Linking Errors Test");
  pTVar3[1]._vptr_TestNode = (_func_int **)pTVar1;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__LinkingErrors_02106b80;
  pTVar3[1].m_testCtx = pTVar1;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  pTVar3 = (TestNode *)operator_new(0x80);
  pTVar1 = (TestContext *)(this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,(TestContext *)pTVar1->m_platform,"limits_test",
             "Transform Feedback Limits Test");
  pTVar3[1]._vptr_TestNode = (_func_int **)pTVar1;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__Limits_02106bb8;
  pTVar3[1].m_testCtx = pTVar1;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  pTVar3 = (TestNode *)operator_new(0xb0);
  pTVar1 = (TestContext *)(this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,(TestContext *)pTVar1->m_platform,"capture_vertex_interleaved_test",
             "Transform Feedback Capture Vertex Interleaved Test");
  pTVar3[1]._vptr_TestNode = (_func_int **)pTVar1;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__CaptureVertexInterleaved_02106bf0;
  pTVar3[1].m_testCtx = pTVar1;
  pTVar3[1].m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar3[1].m_name._M_string_length = 0;
  *(undefined8 *)((long)&pTVar3[1].m_name._M_string_length + 4) = 0;
  *(undefined8 *)((long)&pTVar3[1].m_name.field_2 + 4) = 0;
  *(undefined8 *)((long)&pTVar3[1].m_name.field_2 + 0xc) = 0x800008c8c;
  pTVar3[1].m_description._M_string_length = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  puVar4 = (undefined8 *)operator_new(0xb8);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)(puVar4 + 1),pCVar2->m_testCtx,"capture_geometry_interleaved_test",
             "Transform Feedback Capture Geometry Interleaved Test");
  puVar4[0xf] = pCVar2;
  puVar4[0x10] = pCVar2;
  puVar4[0x11] = 0;
  puVar4[0x12] = 0;
  *(undefined8 *)((long)puVar4 + 0x94) = 0;
  *(undefined8 *)((long)puVar4 + 0x9c) = 0;
  *(undefined8 *)((long)puVar4 + 0xa4) = 0x800008c8c;
  puVar4[0x16] = 0;
  *puVar4 = 0x2106c78;
  puVar4[1] = 0x2106d20;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)(puVar4 + 1));
  puVar4 = (undefined8 *)operator_new(200);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)(puVar4 + 3),pCVar2->m_testCtx,"capture_vertex_separate_test",
             "Transform Feedback Capture Vertex Separate Test");
  puVar4[0x11] = pCVar2;
  puVar4[0x12] = pCVar2;
  puVar4[0x13] = 0;
  puVar4[0x14] = 0;
  *(undefined8 *)((long)puVar4 + 0xa4) = 0;
  *(undefined8 *)((long)puVar4 + 0xac) = 0;
  puVar4[0x18] = 0;
  *puVar4 = 0x2106db8;
  puVar4[3] = 0x2106e68;
  puVar4[1] = 0;
  *(undefined4 *)(puVar4 + 2) = 0;
  *(undefined8 *)((long)puVar4 + 0xb4) = 0x800008c8d;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)(puVar4 + 3));
  this_00 = (CaptureGeometrySeparate *)operator_new(0xe0);
  CaptureGeometrySeparate::CaptureGeometrySeparate
            (this_00,(this->super_TestCaseGroup).m_context,"capture_geometry_separate_test",
             "Transform Feedback Capture Geometry Separate Test");
  tcu::TestNode::addChild
            ((TestNode *)this,
             (TestNode *)
             ((long)&(this_00->super_CaptureGeometryInterleaved)._vptr_CaptureGeometryInterleaved +
             (long)(this_00->super_CaptureGeometryInterleaved)._vptr_CaptureGeometryInterleaved[-3])
            );
  pTVar3 = (TestNode *)operator_new(0x98);
  pTVar1 = (TestContext *)(this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,(TestContext *)pTVar1->m_platform,"get_xfb_varying",
             "Transform Feedback Varying Getters Test");
  pTVar3[1]._vptr_TestNode = (_func_int **)pTVar1;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__CheckGetXFBVarying_02106ee8;
  pTVar3[1].m_testCtx = pTVar1;
  pTVar3[1].m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar3[1].m_name._M_string_length = 0;
  pTVar3[1].m_name.field_2._M_allocated_capacity = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  pTVar3 = (TestNode *)operator_new(0xb8);
  pTVar1 = (TestContext *)(this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,(TestContext *)pTVar1->m_platform,"query_vertex_interleaved_test",
             "Transform Feedback Query Vertex Interleaved Test");
  pTVar3[1]._vptr_TestNode = (_func_int **)pTVar1;
  pTVar3[1].m_testCtx = pTVar1;
  pTVar3[1].m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar3[1].m_name._M_string_length = 0;
  *(undefined8 *)((long)&pTVar3[1].m_name._M_string_length + 4) = 0;
  *(undefined8 *)((long)&pTVar3[1].m_name.field_2 + 4) = 0;
  *(undefined8 *)((long)&pTVar3[1].m_name.field_2 + 0xc) = 0x300008c8c;
  pTVar3[1].m_description._M_string_length = 0;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__CaptureVertexInterleaved_021070a8;
  *(undefined4 *)&pTVar3[1].m_description.field_2 = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  this_01 = (QueryGeometryInterleaved *)operator_new(0xc0);
  QueryGeometryInterleaved::QueryGeometryInterleaved
            (this_01,(this->super_TestCaseGroup).m_context,"query_geometry_interleaved_test",
             "Transform Feedback Query Geometry Interleaved Test");
  tcu::TestNode::addChild
            ((TestNode *)this,
             (TestNode *)
             ((long)&(this_01->super_CaptureGeometryInterleaved)._vptr_CaptureGeometryInterleaved +
             (long)(this_01->super_CaptureGeometryInterleaved)._vptr_CaptureGeometryInterleaved[-3])
            );
  this_02 = (QueryVertexSeparate *)operator_new(200);
  QueryVertexSeparate::QueryVertexSeparate
            (this_02,(this->super_TestCaseGroup).m_context,"query_vertex_separate_test",
             "Transform Feedback Query Vertex Separate Test");
  tcu::TestNode::addChild
            ((TestNode *)this,
             (TestNode *)
             ((long)&(this_02->super_CaptureVertexSeparate)._vptr_CaptureVertexSeparate +
             (long)(this_02->super_CaptureVertexSeparate)._vptr_CaptureVertexSeparate[-3]));
  this_03 = (QueryGeometrySeparate *)operator_new(0xe0);
  QueryGeometrySeparate::QueryGeometrySeparate
            (this_03,(this->super_TestCaseGroup).m_context,"query_geometry_separate_test",
             "Transform Feedback Query Geometry Separate Test");
  tcu::TestNode::addChild
            ((TestNode *)this,
             (TestNode *)
             ((long)&(this_03->super_CaptureGeometrySeparate).super_CaptureGeometryInterleaved.
                     _vptr_CaptureGeometryInterleaved +
             (long)(this_03->super_CaptureGeometrySeparate).super_CaptureGeometryInterleaved.
                   _vptr_CaptureGeometryInterleaved[-3]));
  pTVar3 = (TestNode *)operator_new(0xb0);
  pTVar1 = (TestContext *)(this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,(TestContext *)pTVar1->m_platform,"discard_vertex_test",
             "Transform Feedback Discard Vertex Test");
  pTVar3[1]._vptr_TestNode = (_func_int **)pTVar1;
  pTVar3[1].m_testCtx = pTVar1;
  pTVar3[1].m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar3[1].m_name._M_string_length = 0;
  *(undefined8 *)((long)&pTVar3[1].m_name._M_string_length + 4) = 0;
  *(undefined8 *)((long)&pTVar3[1].m_name.field_2 + 4) = 0;
  *(undefined8 *)((long)&pTVar3[1].m_name.field_2 + 0xc) = 0x800008c8c;
  pTVar3[1].m_description._M_string_length = 0;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__CaptureVertexInterleaved_02107628;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  puVar4 = (undefined8 *)operator_new(0xb8);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)(puVar4 + 1),pCVar2->m_testCtx,"discard_geometry_test",
             "Transform Feedback Discard Geometry Test");
  puVar4[0xf] = pCVar2;
  puVar4[0x10] = pCVar2;
  puVar4[0x11] = 0;
  puVar4[0x12] = 0;
  *(undefined8 *)((long)puVar4 + 0x94) = 0;
  *(undefined8 *)((long)puVar4 + 0x9c) = 0;
  *(undefined8 *)((long)puVar4 + 0xa4) = 0x800008c8c;
  puVar4[0x16] = 0;
  *puVar4 = 0x21076b0;
  puVar4[1] = 0x2107760;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)(puVar4 + 1));
  pTVar3 = (TestNode *)operator_new(0xb0);
  pTVar1 = (TestContext *)(this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,(TestContext *)pTVar1->m_platform,"draw_xfb_test",
             "Transform Feedback Draw Test");
  pTVar3[1]._vptr_TestNode = (_func_int **)pTVar1;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__DrawXFB_02107800;
  pTVar3[1].m_testCtx = pTVar1;
  pTVar3[1].m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar3[1].m_name._M_string_length = 0;
  pTVar3[1].m_name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pTVar3[1].m_name.field_2 + 8) = 0;
  *(undefined8 *)((long)&pTVar3[1].m_name.field_2 + 0xc) = 0;
  *(undefined8 *)((long)&pTVar3[1].m_description._M_dataplus._M_p + 4) = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  pTVar3 = (TestNode *)operator_new(0xa0);
  pTVar1 = (TestContext *)(this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,(TestContext *)pTVar1->m_platform,"draw_xfb_feedbackk_test",
             "Transform Feedback Draw Feedback Test");
  pTVar3[1]._vptr_TestNode = (_func_int **)pTVar1;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__DrawXFBFeedback_02107838;
  pTVar3[1].m_testCtx = pTVar1;
  *(undefined4 *)&pTVar3[1].m_name._M_dataplus._M_p = 0;
  *(undefined4 *)((long)&pTVar3[1].m_name._M_string_length + 4) = 0;
  *(undefined4 *)((long)&pTVar3[1].m_name.field_2 + 8) = 0;
  pTVar3[1].m_name.field_2._M_allocated_capacity = 0x101010101010101;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  pTVar3 = (TestNode *)operator_new(0xb0);
  pTVar1 = (TestContext *)(this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,(TestContext *)pTVar1->m_platform,"draw_xfb_stream_test",
             "Transform Feedback Draw Stream Test");
  pTVar3[1]._vptr_TestNode = (_func_int **)pTVar1;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__DrawXFBStream_021078a8;
  pTVar3[1].m_testCtx = pTVar1;
  pTVar3[1].m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar3[1].m_name._M_string_length = 0;
  pTVar3[1].m_name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pTVar3[1].m_name.field_2 + 8) = 0;
  pTVar3[1].m_description._M_dataplus._M_p = (pointer)0x0;
  pTVar3[1].m_description._M_string_length = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  pTVar3 = (TestNode *)operator_new(0x98);
  pTVar1 = (TestContext *)(this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,(TestContext *)pTVar1->m_platform,"capture_special_interleaved_test"
             ,"Transform Feedback Capture Special Test");
  pTVar3[1]._vptr_TestNode = (_func_int **)pTVar1;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__CaptureSpecialInterleaved_02107870;
  pTVar3[1].m_testCtx = pTVar1;
  pTVar3[1].m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar3[1].m_name._M_string_length = 0;
  *(undefined4 *)&pTVar3[1].m_name.field_2 = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  pTVar3 = (TestNode *)operator_new(0xa0);
  pTVar1 = (TestContext *)(this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,(TestContext *)pTVar1->m_platform,"draw_xfb_instanced_test",
             "Transform Feedback Draw Instanced Test");
  pTVar3[1]._vptr_TestNode = (_func_int **)pTVar1;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__DrawXFBInstanced_021078e0;
  pTVar3[1].m_testCtx = pTVar1;
  pTVar3[1].m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar3[1].m_name._M_string_length = 0;
  pTVar3[1].m_name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pTVar3[1].m_name.field_2 + 8) = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  pTVar3 = (TestNode *)operator_new(0xa8);
  pTVar1 = (TestContext *)(this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,(TestContext *)pTVar1->m_platform,"draw_xfb_stream_instanced_test",
             "Transform Feedback Draw Stream Instanced Test");
  pTVar3[1]._vptr_TestNode = (_func_int **)pTVar1;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__DrawXFBStreamInstanced_02107918;
  pTVar3[1].m_testCtx = pTVar1;
  pTVar3[1].m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar3[1].m_name._M_string_length = 0;
  pTVar3[1].m_name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pTVar3[1].m_name.field_2 + 8) = 0;
  *(undefined4 *)&pTVar3[1].m_description._M_dataplus._M_p = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  return;
}

Assistant:

gl3cts::TransformFeedback::Tests::Tests(deqp::Context& context)
	: TestCaseGroup(context, "transform_feedback", "Transform Feedback Test Suite")
{
	addChild(new TransformFeedback::APIErrors(m_context));
	addChild(new TransformFeedback::LinkingErrors(m_context));
	addChild(new TransformFeedback::Limits(m_context));
	addChild(new TransformFeedback::CaptureVertexInterleaved(m_context, "capture_vertex_interleaved_test",
															 "Transform Feedback Capture Vertex Interleaved Test"));
	addChild(new TransformFeedback::CaptureGeometryInterleaved(m_context, "capture_geometry_interleaved_test",
															   "Transform Feedback Capture Geometry Interleaved Test"));
	addChild(new TransformFeedback::CaptureVertexSeparate(m_context, "capture_vertex_separate_test",
														  "Transform Feedback Capture Vertex Separate Test"));
	addChild(new TransformFeedback::CaptureGeometrySeparate(m_context, "capture_geometry_separate_test",
															"Transform Feedback Capture Geometry Separate Test"));
	addChild(new TransformFeedback::CheckGetXFBVarying(m_context, "get_xfb_varying",
													   "Transform Feedback Varying Getters Test"));
	addChild(new TransformFeedback::QueryVertexInterleaved(m_context, "query_vertex_interleaved_test",
														   "Transform Feedback Query Vertex Interleaved Test"));
	addChild(new TransformFeedback::QueryGeometryInterleaved(m_context, "query_geometry_interleaved_test",
															 "Transform Feedback Query Geometry Interleaved Test"));
	addChild(new TransformFeedback::QueryVertexSeparate(m_context, "query_vertex_separate_test",
														"Transform Feedback Query Vertex Separate Test"));
	addChild(new TransformFeedback::QueryGeometrySeparate(m_context, "query_geometry_separate_test",
														  "Transform Feedback Query Geometry Separate Test"));
	addChild(new TransformFeedback::DiscardVertex(m_context, "discard_vertex_test",
												  "Transform Feedback Discard Vertex Test"));
	addChild(new TransformFeedback::DiscardGeometry(m_context, "discard_geometry_test",
													"Transform Feedback Discard Geometry Test"));
	addChild(new TransformFeedback::DrawXFB(m_context, "draw_xfb_test", "Transform Feedback Draw Test"));
	addChild(new TransformFeedback::DrawXFBFeedback(m_context, "draw_xfb_feedbackk_test",
													"Transform Feedback Draw Feedback Test"));
	addChild(
		new TransformFeedback::DrawXFBStream(m_context, "draw_xfb_stream_test", "Transform Feedback Draw Stream Test"));
	addChild(new TransformFeedback::CaptureSpecialInterleaved(m_context, "capture_special_interleaved_test",
															  "Transform Feedback Capture Special Test"));
	addChild(new TransformFeedback::DrawXFBInstanced(m_context, "draw_xfb_instanced_test",
													 "Transform Feedback Draw Instanced Test"));
	addChild(new TransformFeedback::DrawXFBStreamInstanced(m_context, "draw_xfb_stream_instanced_test",
														   "Transform Feedback Draw Stream Instanced Test"));
}